

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::tuple_caster<std::tuple,double,double,double>::
       cast_impl<std::tuple<double,double,double>,0ul,1ul,2ul>
                 (tuple<double,_double,_double> *src,return_value_policy policy,handle parent)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  __tuple_element_t<0UL,_tuple<double,_double,_double>_> *p_Var4;
  type tVar5;
  __tuple_element_t<1UL,_tuple<double,_double,_double>_> *p_Var6;
  __tuple_element_t<2UL,_tuple<double,_double,_double>_> *p_Var7;
  iterator pvVar8;
  PyObject **ppPVar9;
  handle local_f0;
  iterator local_e8;
  value_type *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_3UL> *__range3_1;
  int counter;
  tuple result;
  value_type *entry;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_3UL> *__range3;
  undefined1 local_48 [8];
  array<pybind11::object,_3UL> entries;
  return_value_policy policy_local;
  tuple<double,_double,_double> *src_local;
  handle parent_local;
  
  entries._M_elems[2].super_handle.m_ptr._7_1_ = policy;
  p_Var4 = std::get<0ul,double,double,double>(src);
  tVar5 = type_caster<double,_void>::cast<double>
                    (*p_Var4,entries._M_elems[2].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)local_48,(handle)tVar5.m_ptr);
  p_Var6 = std::get<1ul,double,double,double>(src);
  tVar5 = type_caster<double,_void>::cast<double>
                    (*p_Var6,entries._M_elems[2].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)&entries,(handle)tVar5.m_ptr);
  p_Var7 = std::get<2ul,double,double,double>(src);
  tVar5 = type_caster<double,_void>::cast<double>
                    (*p_Var7,entries._M_elems[2].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)(entries._M_elems + 1),(handle)tVar5.m_ptr);
  __end0 = std::array<pybind11::object,_3UL>::begin((array<pybind11::object,_3UL> *)local_48);
  pvVar8 = std::array<pybind11::object,_3UL>::end((array<pybind11::object,_3UL> *)local_48);
  do {
    if (__end0 == pvVar8) {
      pybind11::tuple::tuple((tuple *)&stack0xffffffffffffff40,3);
      __range3_1._4_4_ = 0;
      __begin0_1 = (iterator)local_48;
      __end0_1 = std::array<pybind11::object,_3UL>::begin
                           ((array<pybind11::object,_3UL> *)__begin0_1);
      entry_1 = std::array<pybind11::object,_3UL>::end((array<pybind11::object,_3UL> *)__begin0_1);
      for (; __end0_1 != entry_1; __end0_1 = __end0_1 + 1) {
        local_e8 = __end0_1;
        local_f0 = pybind11::object::release(__end0_1);
        ppPVar9 = handle::ptr(&local_f0);
        pPVar1 = (PyTypeObject *)*ppPVar9;
        ppPVar9 = handle::ptr((handle *)&stack0xffffffffffffff40);
        iVar3 = PyType_HasFeature((*ppPVar9)->ob_type,0x4000000);
        if (iVar3 == 0) {
          __assert_fail("PyTuple_Check(result.ptr())",
                        "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/cast.h"
                        ,0x588,
                        "static handle pybind11::detail::tuple_caster<std::tuple, double, double, double>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <double, double, double>, T = std::tuple<double, double, double>, Is = <0UL, 1UL, 2UL>]"
                       );
        }
        ppPVar9 = handle::ptr((handle *)&stack0xffffffffffffff40);
        (&(*ppPVar9)[1].ob_type)[__range3_1._4_4_] = pPVar1;
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
      }
      parent_local = pybind11::object::release((object *)&stack0xffffffffffffff40);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      pybind11::tuple::~tuple((tuple *)&stack0xffffffffffffff40);
LAB_002eb075:
      std::array<pybind11::object,_3UL>::~array((array<pybind11::object,_3UL> *)local_48);
      return (handle)parent_local.m_ptr;
    }
    bVar2 = handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) {
      memset(&parent_local,0,8);
      handle::handle(&parent_local);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      goto LAB_002eb075;
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }